

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O2

int per_ext(double *sig,int len,int a,double *oup)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = (ulong)(uint)a;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < len) {
    uVar6 = (ulong)(uint)len;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    oup[(long)a + uVar5] = sig[uVar5];
  }
  iVar4 = len;
  if ((len & 1U) != 0) {
    iVar4 = len + 1;
    oup[len + a] = sig[(long)len + -1];
  }
  uVar5 = 0;
  uVar6 = 0;
  if (0 < a) {
    uVar6 = (ulong)(uint)a;
  }
  for (; iVar2 = (int)uVar3 + -1, uVar6 != uVar5; uVar5 = uVar5 + 1) {
    dVar1 = oup[(long)a + uVar5];
    uVar3 = (ulong)iVar2;
    oup[uVar3] = oup[iVar4 + iVar2];
    oup[(long)(iVar4 + a) + uVar5] = dVar1;
  }
  return iVar4;
}

Assistant:

int per_ext(double *sig, int len, int a, double *oup) {
	int i, len2;
	double temp1;
	double temp2;
	for (i = 0; i < len; ++i) {
		oup[a + i] = sig[i];
	}
	len2 = len;
	if ((len % 2) != 0) {
		len2 = len + 1;
		oup[a + len] = sig[len - 1];
	}
	for (i = 0; i < a; ++i) {
		temp1 = oup[a + i];
		temp2 = oup[a + len2 - 1 - i];
		oup[a - 1 - i] = temp2;
		oup[len2 + a + i] = temp1;
	}
	return len2;
}